

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

timeval __thiscall absl::lts_20250127::ToTimeval(lts_20250127 *this,Time t)

{
  Time t_00;
  timeval tVar1;
  timespec tVar2;
  undefined8 local_48;
  timespec ts;
  Time t_local;
  timeval tv;
  
  t_00.rep_.rep_lo_ = t.rep_.rep_hi_.lo_;
  t_00.rep_.rep_hi_ = (HiRep)this;
  tVar2 = ToTimespec(t_00);
  local_48 = tVar2.tv_sec;
  ts.tv_sec = tVar2.tv_nsec;
  tVar1.tv_usec = (long)(int)(ts.tv_sec / 1000);
  tVar1.tv_sec = local_48;
  return tVar1;
}

Assistant:

timeval ToTimeval(Time t) {
  timeval tv;
  timespec ts = absl::ToTimespec(t);
  tv.tv_sec = static_cast<decltype(tv.tv_sec)>(ts.tv_sec);
  if (tv.tv_sec != ts.tv_sec) {  // narrowing
    if (ts.tv_sec < 0) {
      tv.tv_sec = std::numeric_limits<decltype(tv.tv_sec)>::min();
      tv.tv_usec = 0;
    } else {
      tv.tv_sec = std::numeric_limits<decltype(tv.tv_sec)>::max();
      tv.tv_usec = 1000 * 1000 - 1;
    }
    return tv;
  }
  tv.tv_usec = static_cast<int>(ts.tv_nsec / 1000);  // suseconds_t
  return tv;
}